

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

char * __thiscall cmsys::RegExpCompile::regatom(RegExpCompile *this,int *flagp)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  int flags;
  uint local_1c;
  
  *flagp = 0;
  pbVar8 = (byte *)this->regparse;
  pbVar7 = pbVar8 + 1;
  this->regparse = (char *)pbVar7;
  bVar1 = *pbVar8;
  if (bVar1 < 0x3f) {
    switch(bVar1) {
    case 0x24:
      pcVar10 = this->regcode;
      if (pcVar10 == &regdummy) {
LAB_00129af0:
        this->regsize = this->regsize + 3;
        return &regdummy;
      }
      pcVar10[0] = '\x02';
      pcVar10[1] = '\0';
LAB_00129988:
      pcVar10[2] = '\0';
      this->regcode = pcVar10 + 3;
      return pcVar10;
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x2c:
    case 0x2d:
      goto switchD_00129936_caseD_25;
    case 0x28:
      pcVar10 = reg(this,1,(int *)&local_1c);
      if (pcVar10 == (char *)0x0) {
        return (char *)0x0;
      }
      *flagp = *flagp | local_1c & 5;
      return pcVar10;
    case 0x29:
      break;
    case 0x2a:
    case 0x2b:
switchD_00129936_caseD_2a:
      pcVar10 = "RegularExpression::compile(): ?+* follows nothing.";
      goto LAB_00129a21;
    case 0x2e:
      pcVar10 = this->regcode;
      if (pcVar10 == &regdummy) {
        this->regsize = this->regsize + 3;
        uVar5 = 3;
      }
      else {
        pcVar10[0] = '\x03';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        this->regcode = pcVar10 + 3;
        uVar5 = *flagp | 3;
      }
      *flagp = uVar5;
      return pcVar10;
    default:
      if (bVar1 != 0) goto switchD_00129936_caseD_25;
    }
  }
  else {
    if (bVar1 < 0x5c) {
      if (bVar1 == 0x3f) goto switchD_00129936_caseD_2a;
      if (bVar1 == 0x5b) {
        pcVar10 = this->regcode;
        pbVar8 = &regdummy;
        if (*pbVar7 == 0x5e) {
          if (pcVar10 == &regdummy) {
            this->regsize = this->regsize + 3;
          }
          else {
            pcVar10[0] = '\x05';
            pcVar10[1] = '\0';
            pbVar8 = (byte *)(pcVar10 + 3);
            pcVar10[2] = '\0';
            this->regcode = (char *)pbVar8;
            pbVar7 = (byte *)this->regparse;
          }
          pbVar7 = pbVar7 + 1;
          this->regparse = (char *)pbVar7;
        }
        else if (pcVar10 == &regdummy) {
          this->regsize = this->regsize + 3;
          pcVar10 = &regdummy;
        }
        else {
          pcVar10[0] = '\x04';
          pcVar10[1] = '\0';
          pbVar8 = (byte *)(pcVar10 + 3);
          pcVar10[2] = '\0';
          this->regcode = (char *)pbVar8;
          pbVar7 = (byte *)this->regparse;
        }
        if ((*pbVar7 == 0x5d) || (*pbVar7 == 0x2d)) {
          this->regparse = (char *)(pbVar7 + 1);
          if (pbVar8 == &regdummy) {
            this->regsize = this->regsize + 1;
          }
          else {
            bVar1 = *pbVar7;
            this->regcode = (char *)(pbVar8 + 1);
            *pbVar8 = bVar1;
          }
        }
LAB_00129c56:
        while( true ) {
          pcVar9 = this->regparse;
          cVar2 = *pcVar9;
          if (cVar2 == '-') break;
          if ((cVar2 == '\0') || (cVar2 == ']')) {
            pcVar11 = this->regcode;
            if (pcVar11 == &regdummy) {
              this->regsize = this->regsize + 1;
            }
            else {
              this->regcode = pcVar11 + 1;
              *pcVar11 = '\0';
              pcVar9 = this->regparse;
            }
            if (*pcVar9 != ']') {
              pcVar10 = "RegularExpression::compile(): Unmatched [].";
              goto LAB_00129a21;
            }
            this->regparse = pcVar9 + 1;
            goto LAB_00129d28;
          }
          this->regparse = pcVar9 + 1;
          pcVar11 = this->regcode;
          if (pcVar11 == &regdummy) {
LAB_00129cba:
            this->regsize = this->regsize + 1;
          }
          else {
            cVar2 = *pcVar9;
            this->regcode = pcVar11 + 1;
            *pcVar11 = cVar2;
          }
        }
        pcVar11 = pcVar9 + 1;
        this->regparse = pcVar11;
        bVar1 = pcVar9[1];
        if ((bVar1 == 0x5d) || (bVar1 == 0)) {
          pcVar9 = this->regcode;
          if (pcVar9 == &regdummy) goto LAB_00129cba;
          this->regcode = pcVar9 + 1;
          *pcVar9 = '-';
          goto LAB_00129c56;
        }
        bVar3 = pcVar9[-1];
        uVar5 = (uint)bVar3;
        if (bVar3 <= bVar1) {
          if (bVar3 < bVar1) {
            do {
              pcVar9 = this->regcode;
              if (pcVar9 == &regdummy) {
                this->regsize = this->regsize + 1;
              }
              else {
                this->regcode = pcVar9 + 1;
                *pcVar9 = (char)uVar5 + '\x01';
              }
              uVar5 = uVar5 + 1;
            } while (bVar1 != uVar5);
            pcVar11 = this->regparse;
          }
          this->regparse = pcVar11 + 1;
          goto LAB_00129c56;
        }
        pcVar10 = "RegularExpression::compile(): Invalid range in [].";
        goto LAB_00129a21;
      }
    }
    else {
      if (bVar1 == 0x5c) {
        if (*pbVar7 == 0) {
          pcVar10 = "RegularExpression::compile(): Trailing backslash.";
          goto LAB_00129a21;
        }
        pcVar10 = this->regcode;
        if (pcVar10 == &regdummy) {
          this->regsize = this->regsize + 3;
          this->regparse = (char *)(pbVar8 + 2);
LAB_00129bfb:
          this->regsize = this->regsize + 1;
        }
        else {
          pcVar10[0] = '\b';
          pcVar10[1] = '\0';
          pcVar10[2] = '\0';
          this->regcode = pcVar10 + 3;
          pcVar9 = this->regparse;
          this->regparse = pcVar9 + 1;
          if (pcVar10 + 3 == &regdummy) goto LAB_00129bfb;
          cVar2 = *pcVar9;
          this->regcode = pcVar10 + 4;
          pcVar10[3] = cVar2;
          pcVar9 = this->regcode;
          if (pcVar9 != &regdummy) {
            this->regcode = pcVar9 + 1;
            *pcVar9 = '\0';
            goto LAB_00129d28;
          }
        }
        this->regsize = this->regsize + 1;
LAB_00129d28:
        *(byte *)flagp = (byte)*flagp | 3;
        return pcVar10;
      }
      if (bVar1 == 0x7c) goto switchD_00129936_caseD_29;
      if (bVar1 == 0x5e) {
        pcVar10 = this->regcode;
        if (pcVar10 == &regdummy) goto LAB_00129af0;
        pcVar10[0] = '\x01';
        pcVar10[1] = '\0';
        goto LAB_00129988;
      }
    }
switchD_00129936_caseD_25:
    this->regparse = (char *)pbVar8;
    sVar4 = strcspn((char *)pbVar8,"^$.[()|?+*\\");
    uVar5 = (uint)sVar4;
    if (0 < (int)uVar5) {
      if (uVar5 == 1) {
        iVar6 = 3;
        uVar5 = 1;
      }
      else {
        iVar6 = 1;
        if (((ulong)pbVar8[uVar5 & 0x7fffffff] < 0x40) &&
           ((0x80000c0000000000U >> ((ulong)pbVar8[uVar5 & 0x7fffffff] & 0x3f) & 1) != 0)) {
          uVar5 = uVar5 - 1;
          iVar6 = (uint)(uVar5 == 1) * 2 + 1;
        }
      }
      *flagp = iVar6;
      pcVar10 = this->regcode;
      if (pcVar10 == &regdummy) {
        this->regsize = this->regsize + 3;
      }
      else {
        pcVar10[0] = '\b';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        this->regcode = pcVar10 + 3;
      }
      iVar6 = uVar5 + 1;
      do {
        pcVar9 = this->regparse;
        pcVar11 = this->regcode;
        this->regparse = pcVar9 + 1;
        if (pcVar11 == &regdummy) {
          this->regsize = this->regsize + 1;
        }
        else {
          cVar2 = *pcVar9;
          this->regcode = pcVar11 + 1;
          *pcVar11 = cVar2;
        }
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      pcVar9 = this->regcode;
      if (pcVar9 == &regdummy) {
        this->regsize = this->regsize + 1;
        return pcVar10;
      }
      this->regcode = pcVar9 + 1;
      *pcVar9 = '\0';
      return pcVar10;
    }
  }
switchD_00129936_caseD_29:
  pcVar10 = "RegularExpression::compile(): Internal error.";
LAB_00129a21:
  puts(pcVar10);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::regatom(int* flagp)
{
  char* ret;
  int flags;

  *flagp = WORST; // Tentatively.

  switch (*regparse++) {
    case '^':
      ret = regnode(BOL);
      break;
    case '$':
      ret = regnode(EOL);
      break;
    case '.':
      ret = regnode(ANY);
      *flagp |= HASWIDTH | SIMPLE;
      break;
    case '[': {
      int rxpclass;
      int rxpclassend;

      if (*regparse == '^') { // Complement of range.
        ret = regnode(ANYBUT);
        regparse++;
      } else
        ret = regnode(ANYOF);
      if (*regparse == ']' || *regparse == '-')
        regc(*regparse++);
      while (*regparse != '\0' && *regparse != ']') {
        if (*regparse == '-') {
          regparse++;
          if (*regparse == ']' || *regparse == '\0')
            regc('-');
          else {
            rxpclass = UCHARAT(regparse - 2) + 1;
            rxpclassend = UCHARAT(regparse);
            if (rxpclass > rxpclassend + 1) {
              // RAISE Error, SYM(RegularExpression), SYM(Invalid_Range),
              printf("RegularExpression::compile(): Invalid range in [].\n");
              return nullptr;
            }
            for (; rxpclass <= rxpclassend; rxpclass++)
              regc(static_cast<char>(rxpclass));
            regparse++;
          }
        } else
          regc(*regparse++);
      }
      regc('\0');
      if (*regparse != ']') {
        // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Bracket),
        printf("RegularExpression::compile(): Unmatched [].\n");
        return nullptr;
      }
      regparse++;
      *flagp |= HASWIDTH | SIMPLE;
    } break;
    case '(':
      ret = reg(1, &flags);
      if (ret == nullptr)
        return (nullptr);
      *flagp |= flags & (HASWIDTH | SPSTART);
      break;
    case '\0':
    case '|':
    case ')':
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n"); // Never here
      return nullptr;
    case '?':
    case '+':
    case '*':
      // RAISE Error, SYM(RegularExpression), SYM(No_Operand),
      printf("RegularExpression::compile(): ?+* follows nothing.\n");
      return nullptr;
    case '\\':
      if (*regparse == '\0') {
        // RAISE Error, SYM(RegularExpression), SYM(Trailing_Backslash),
        printf("RegularExpression::compile(): Trailing backslash.\n");
        return nullptr;
      }
      ret = regnode(EXACTLY);
      regc(*regparse++);
      regc('\0');
      *flagp |= HASWIDTH | SIMPLE;
      break;
    default: {
      int len;
      char ender;

      regparse--;
      len = int(strcspn(regparse, META));
      if (len <= 0) {
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf("RegularExpression::compile(): Internal error.\n");
        return nullptr;
      }
      ender = *(regparse + len);
      if (len > 1 && ISMULT(ender))
        len--; // Back off clear of ?+* operand.
      *flagp |= HASWIDTH;
      if (len == 1)
        *flagp |= SIMPLE;
      ret = regnode(EXACTLY);
      while (len > 0) {
        regc(*regparse++);
        len--;
      }
      regc('\0');
    } break;
  }
  return (ret);
}